

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O1

int mario::sockets::close(int __fd)

{
  int iVar1;
  int extraout_EAX;
  Writer *pWVar2;
  Writer local_80;
  
  iVar1 = ::close(__fd);
  if (iVar1 < 0) {
    local_80._vptr_Writer = (_func_int **)&PTR__Writer_0012dcf0;
    local_80.m_msg = (LogMessage *)0x0;
    local_80.m_level = Fatal;
    local_80.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/SocketsOps.cpp"
    ;
    local_80.m_line = 0x41;
    local_80.m_func = "void mario::sockets::close(int)";
    local_80.m_verboseLevel = 0;
    local_80.m_logger = (Logger *)0x0;
    local_80.m_proceed = false;
    local_80.m_messageBuilder.m_logger = (Logger *)0x0;
    local_80.m_messageBuilder.m_containerLogSeperator = "";
    local_80.m_dispatchAction = NormalLog;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_80,1,"default");
    if (pWVar2->m_proceed == true) {
      el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,"sockets::close");
    }
    el::base::Writer::~Writer(&local_80);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void sockets::close(int sockfd) {
    if (::close(sockfd) < 0) {
        LOG(FATAL) << "sockets::close";
    }
}